

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrSTA0x99(CPU *this)

{
  Memory *this_00;
  uint16_t uVar1;
  
  this_00 = this->m;
  uVar1 = Memory::Read16(this_00,this->PC);
  this->PC = this->PC + 2;
  Memory::Write8(this_00,this->Y + uVar1,this->A);
  return 5;
}

Assistant:

int CPU::instrSTA0x99() {
	m->Write8(absolute_y_addr_j(), A);
	return 5;
}